

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,ArithmeticalExpression *expression)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Value *pVVar5;
  VariableValue *pVVar6;
  PrimitiveSimpleObject *pPVar7;
  Type *pTVar8;
  string *psVar9;
  int iVar10;
  _Alloc_hider _Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string local_70;
  string local_50;
  
  if (&expression->lhs_->super_Node == (Node *)0x0) {
    pVVar5 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
    iVar10 = (*pVVar5->_vptr_Value[2])(pVVar5);
    pVVar6 = (VariableValue *)operator_new(0x50);
    pPVar7 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar8 = (Type *)operator_new(0x28);
    paVar12 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"int","");
    Type::Type(pTVar8,&local_50);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar7,pTVar8);
    VariableValue::VariableValue(pVVar6,pPVar7,-iVar10);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar6;
    _Var11._M_p = local_50._M_dataplus._M_p;
  }
  else {
    pVVar5 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->lhs_->super_Node);
    iVar1 = (*pVVar5->_vptr_Value[2])(pVVar5);
    pVVar5 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
    iVar2 = (*pVVar5->_vptr_Value[2])(pVVar5);
    psVar9 = &expression->operation_;
    iVar3 = std::__cxx11::string::compare((char *)psVar9);
    iVar10 = 0;
    if (iVar3 == 0) {
      iVar10 = iVar2 + iVar1;
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar9);
    iVar3 = iVar1 - iVar2;
    if (iVar4 != 0) {
      iVar3 = iVar10;
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar9);
    iVar10 = iVar2 * iVar1;
    if (iVar4 != 0) {
      iVar10 = iVar3;
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar9);
    if (iVar3 == 0) {
      iVar10 = iVar1 / iVar2;
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar9);
    if (iVar3 == 0) {
      iVar10 = iVar1 % iVar2;
    }
    pVVar6 = (VariableValue *)operator_new(0x50);
    pPVar7 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar8 = (Type *)operator_new(0x28);
    paVar12 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"int","");
    Type::Type(pTVar8,&local_70);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar7,pTVar8);
    VariableValue::VariableValue(pVVar6,pPVar7,iVar10);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar6;
    _Var11._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var11._M_p != paVar12) {
    operator_delete(_Var11._M_p,paVar12->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(ArithmeticalExpression* expression) {
  if (expression->lhs_ == nullptr) {
    auto rhs = Accept(expression->rhs_)->GetValue();

    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("int")), -rhs);
  } else {
    auto lhs = Accept(expression->lhs_)->GetValue();
    auto rhs = Accept(expression->rhs_)->GetValue();
    int result = 0;

    if (expression->operation_ == "+") {
      result = lhs + rhs;
    }
    if (expression->operation_ == "-") {
      result = lhs - rhs;
    }
    if (expression->operation_ == "*") {
      result = lhs * rhs;
    }
    if (expression->operation_ == "/") {
      result = lhs / rhs;
    }
    if (expression->operation_ == "%") {
      result = lhs % rhs;
    }

    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("int")), result);
  }
}